

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

void LineLineTieBreaker(ON_Line *line0,ON_Line *line1,ON_3dPoint *Q0,ON_3dPoint *Q1)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double local_c8;
  double c;
  double c1;
  double c0;
  int i;
  bool bHaveIsoCoords1;
  undefined1 local_68 [7];
  bool bHaveIsoCoords0;
  ON_3dPoint C1;
  ON_3dPoint C0;
  double line1_length;
  double line0_length;
  ON_3dPoint *Q1_local;
  ON_3dPoint *Q0_local;
  ON_Line *line1_local;
  ON_Line *line0_local;
  
  dVar6 = ON_Line::Length(line0);
  dVar7 = ON_Line::Length(line1);
  bVar3 = GetLineIsoCoordinates(line0,*Q0,(ON_3dPoint *)&C1.z);
  bVar4 = GetLineIsoCoordinates(line1,*Q1,(ON_3dPoint *)local_68);
  if ((bVar3) || (bVar4)) {
    for (c0._4_4_ = 0; c0._4_4_ < 3; c0._4_4_ = c0._4_4_ + 1) {
      pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&C1.z,c0._4_4_);
      dVar1 = *pdVar5;
      pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)local_68,c0._4_4_);
      dVar2 = *pdVar5;
      if ((((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) || (dVar2 != -1.23432101234321e+308))
         || (NAN(dVar2))) {
        if ((((dVar1 != dVar2) || (local_c8 = dVar1, NAN(dVar1) || NAN(dVar2))) &&
            ((dVar1 != -1.23432101234321e+308 || (local_c8 = dVar2, NAN(dVar1))))) &&
           (((dVar2 != -1.23432101234321e+308 || (local_c8 = dVar1, NAN(dVar2))) &&
            (local_c8 = dVar2, dVar7 < dVar6)))) {
          local_c8 = dVar1;
        }
        if (((local_c8 != -1.23432101234321e+308) || (NAN(local_c8))) &&
           (bVar3 = ON_IsValid(local_c8), bVar3)) {
          pdVar5 = ON_3dPoint::operator[](Q0,c0._4_4_);
          *pdVar5 = local_c8;
          pdVar5 = ON_3dPoint::operator[](Q1,c0._4_4_);
          *pdVar5 = local_c8;
        }
      }
    }
  }
  return;
}

Assistant:

static void LineLineTieBreaker( const ON_Line& line0, const ON_Line& line1, 
                                ON_3dPoint& Q0, ON_3dPoint& Q1 )
{
  double line0_length = line0.Length();
  double line1_length = line1.Length();

  ON_3dPoint C0, C1;
  bool bHaveIsoCoords0 = GetLineIsoCoordinates(line0,Q0,C0);
  bool bHaveIsoCoords1 = GetLineIsoCoordinates(line1,Q1,C1);
  if ( bHaveIsoCoords0 || bHaveIsoCoords1 )
  {
    for ( int i = 0; i < 3; i++ )
    {
      double c0 = C0[i];
      double c1 = C1[i];
      if ( ON_UNSET_VALUE == c0 && ON_UNSET_VALUE == c1 )
        continue;
      double c = ON_UNSET_VALUE;
      if ( c0 == c1 )
        c = c0;
      else if ( ON_UNSET_VALUE == c0 )
        c = c1;
      else if ( ON_UNSET_VALUE == c1 )
        c = c0;
      else if ( line0_length > line1_length )
        c = c0;
      else
        c = c1;
      if ( ON_UNSET_VALUE != c && ON_IsValid(c) )
      {
        Q0[i] = c;
        Q1[i] = c;
      }
    }
  }
}